

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O2

void __thiscall
QConfFileSettingsPrivate::QConfFileSettingsPrivate
          (QConfFileSettingsPrivate *this,QString *fileName,Format format)

{
  QConfFile *t;
  
  QSettingsPrivate::QSettingsPrivate(&this->super_QSettingsPrivate,format);
  (this->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QConfFileSettingsPrivate_0066a918;
  (this->confFiles).d.size = 0;
  (this->confFiles).d.d = (Data *)0x0;
  (this->confFiles).d.ptr = (QConfFile **)0x0;
  (this->extension).d.d = (Data *)0x0;
  (this->extension).d.ptr = (char16_t *)0x0;
  (this->extension).d.size = 0;
  this->nextPosition = 0x40000000;
  initFormat(this);
  t = QConfFile::fromName(fileName,true);
  QList<QConfFile_*>::append(&this->confFiles,t);
  (*(this->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData._vptr_QObjectData[0xd])
            (this);
  return;
}

Assistant:

QConfFileSettingsPrivate::QConfFileSettingsPrivate(const QString &fileName,
                                                   QSettings::Format format)
    : QSettingsPrivate(format),
      nextPosition(0x40000000) // big positive number
{
    initFormat();

    confFiles.append(QConfFile::fromName(fileName, true));

    initAccess();
}